

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O2

Ivy_Obj_t * Ivy_Exor(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *p1_00;
  
  pIVar1 = Ivy_And(p,p0,(Ivy_Obj_t *)((ulong)p1 ^ 1));
  p1_00 = Ivy_And(p,(Ivy_Obj_t *)((ulong)p0 ^ 1),p1);
  pIVar1 = Ivy_Or(p,pIVar1,p1_00);
  return pIVar1;
}

Assistant:

Ivy_Obj_t * Ivy_Exor( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1 )
{
/*
    // check trivial cases
    if ( p0 == p1 )
        return Ivy_Not(p->pConst1);
    if ( p0 == Ivy_Not(p1) )
        return p->pConst1;
    if ( Ivy_Regular(p0) == p->pConst1 )
        return Ivy_NotCond( p1, p0 == p->pConst1 );
    if ( Ivy_Regular(p1) == p->pConst1 )
        return Ivy_NotCond( p0, p1 == p->pConst1 );
    // check the table
    return Ivy_CanonExor( p, p0, p1 );
*/
    return Ivy_Or( p, Ivy_And(p, p0, Ivy_Not(p1)), Ivy_And(p, Ivy_Not(p0), p1) );
}